

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_printf(roaring_bitmap_t *r)

{
  long lVar1;
  long lVar2;
  
  putchar(0x7b);
  if (0 < (r->high_low_container).size) {
    lVar2 = 0;
    do {
      container_printf_as_uint32_array
                ((r->high_low_container).containers[lVar2],(r->high_low_container).typecodes[lVar2],
                 (uint)(r->high_low_container).keys[lVar2] << 0x10);
      lVar2 = lVar2 + 1;
      lVar1 = (long)(r->high_low_container).size;
      if (lVar2 < lVar1) {
        putchar(0x2c);
        lVar1 = (long)(r->high_low_container).size;
      }
    } while (lVar2 < lVar1);
  }
  putchar(0x7d);
  return;
}

Assistant:

void roaring_bitmap_printf(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    printf("{");
    for (int i = 0; i < ra->size; ++i) {
        container_printf_as_uint32_array(ra->containers[i], ra->typecodes[i],
                                         ((uint32_t)ra->keys[i]) << 16);

        if (i + 1 < ra->size) {
            printf(",");
        }
    }
    printf("}");
}